

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressionMargin(void *src,size_t srcSize)

{
  size_t sVar1;
  unsigned_long_long uVar2;
  size_t sVar3;
  size_t unaff_R13;
  bool bVar4;
  ZSTD_frameSizeInfo frameSizeInfo;
  ZSTD_frameHeader zfh;
  uint local_84;
  long local_80;
  ZSTD_frameSizeInfo local_78;
  ZSTD_frameHeader local_60;
  
  local_80 = 0;
  local_84 = 0;
  do {
    if (srcSize == 0) {
      return local_80 + (ulong)local_84;
    }
    ZSTD_findFrameSizeInfo(&local_78,src,srcSize);
    uVar2 = local_78.decompressedBound;
    sVar1 = local_78.compressedSize;
    bVar4 = false;
    sVar3 = ZSTD_getFrameHeader_advanced(&local_60,src,srcSize,ZSTD_f_zstd1);
    if (sVar3 < 0xffffffffffffff89) {
      bVar4 = false;
      if ((sVar1 < 0xffffffffffffff89) && (uVar2 != 0xfffffffffffffffe)) {
        if (local_60.frameType == ZSTD_skippableFrame) {
          local_80 = local_80 + sVar1;
        }
        else {
          if (local_60.frameType != ZSTD_frame) {
            __assert_fail("zfh.frameType == ZSTD_skippableFrame",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x9ea5,"size_t ZSTD_decompressionMargin(const void *, size_t)");
          }
          local_80 = local_78.nbBlocks * 3 +
                     local_80 + (ulong)local_60.headerSize + (ulong)(local_60.checksumFlag != 0) * 4
          ;
          if (local_84 <= local_60.blockSizeMax) {
            local_84 = local_60.blockSizeMax;
          }
        }
        bVar4 = srcSize < sVar1;
        srcSize = srcSize - sVar1;
        if (bVar4) {
          __assert_fail("srcSize >= compressedSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x9eaa,"size_t ZSTD_decompressionMargin(const void *, size_t)");
        }
        src = (void *)((long)src + sVar1);
        bVar4 = true;
        sVar3 = unaff_R13;
      }
      else {
        sVar3 = 0xffffffffffffffec;
      }
    }
    unaff_R13 = sVar3;
    if (!bVar4) {
      return sVar3;
    }
  } while( true );
}

Assistant:

size_t ZSTD_decompressionMargin(void const* src, size_t srcSize)
{
    size_t margin = 0;
    unsigned maxBlockSize = 0;

    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        ZSTD_frameHeader zfh;

        FORWARD_IF_ERROR(ZSTD_getFrameHeader(&zfh, src, srcSize), "");
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ERROR(corruption_detected);

        if (zfh.frameType == ZSTD_frame) {
            /* Add the frame header to our margin */
            margin += zfh.headerSize;
            /* Add the checksum to our margin */
            margin += zfh.checksumFlag ? 4 : 0;
            /* Add 3 bytes per block */
            margin += 3 * frameSizeInfo.nbBlocks;

            /* Compute the max block size */
            maxBlockSize = MAX(maxBlockSize, zfh.blockSizeMax);
        } else {
            assert(zfh.frameType == ZSTD_skippableFrame);
            /* Add the entire skippable frame size to our margin. */
            margin += compressedSize;
        }

        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
    }

    /* Add the max block size back to the margin. */
    margin += maxBlockSize;

    return margin;
}